

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
::operator()(void *this,char *value_text,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x)

{
  bool bVar1;
  size_t sVar2;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  matcher;
  stringstream ss;
  StringMatchResultListener listener;
  undefined1 local_390 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_360;
  stringstream local_348 [16];
  long local_338 [14];
  ios_base local_2c8 [264];
  MatchResultListener local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_360,(PolymorphicMatcher *)value_text);
  local_1c0.stream_ = (ostream *)0x0;
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_018ce6e0;
  bVar1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::MatchAndExplain(&local_360,in_RCX,&local_1c0);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream(local_348);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"Value of: ",10);
    if (x == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::ios::clear((int)(ostream *)local_338 + (int)*(undefined8 *)(local_338[0] + -0x18));
    }
    else {
      sVar2 = strlen((char *)x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,(char *)x,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"Expected: ",10);
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo(&local_360,(ostream *)local_338);
    local_1c0.stream_ = local_1a0;
    local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
    std::__cxx11::stringstream::stringstream(local_1b0);
    bVar1 = MatchPrintAndExplain<std::__cxx11::string_const,std::__cxx11::string_const&>
                      (in_RCX,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                               *)&local_360,&local_1c0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_338,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_338,local_380._M_dataplus._M_p,local_380._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<((AssertionResult *)local_390,&local_380);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (local_388._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_388._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    std::__cxx11::stringstream::~stringstream(local_348);
    std::ios_base::~ios_base(local_2c8);
  }
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_360);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }